

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O1

Abc_Obj_t *
Abc_NtkCreateCofLut(Abc_Ntk_t *pNtkNew,DdManager *dd,DdNode *bCof,Abc_Obj_t *pNode,int Level)

{
  Abc_Obj_t *pObj;
  DdNode *n;
  DdNode *n_00;
  long lVar1;
  
  if (Level < (pNode->vFanins).nSize) {
    pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (Level < (pNode->vFanins).nSize) {
      lVar1 = (long)Level;
      do {
        Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)
                              ((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar1]] +
                              0x40));
        lVar1 = lVar1 + 1;
      } while (lVar1 < (pNode->vFanins).nSize);
    }
    n = Extra_bddMove(dd,bCof,-Level);
    Cudd_Ref(n);
    n_00 = Extra_TransferLevelByLevel(dd,(DdManager *)pNtkNew->pManFunc,n);
    (pObj->field_5).pData = n_00;
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,n);
    return pObj;
  }
  __assert_fail("Abc_ObjFaninNum(pNode) > Level",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                ,0x17e,
                "Abc_Obj_t *Abc_NtkCreateCofLut(Abc_Ntk_t *, DdManager *, DdNode *, Abc_Obj_t *, int)"
               );
}

Assistant:

Abc_Obj_t * Abc_NtkCreateCofLut( Abc_Ntk_t * pNtkNew, DdManager * dd, DdNode * bCof, Abc_Obj_t * pNode, int Level )
{
    int fVerbose = 0;
    DdNode * bFuncNew;
    Abc_Obj_t * pNodeNew;
    int i;
    assert( Abc_ObjFaninNum(pNode) > Level );
    // create a new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins in the order, in which they appear in the reordered manager
    for ( i = Level; i < Abc_ObjFaninNum(pNode); i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_ObjFanin(pNode, i)->pCopy );
if ( fVerbose )
{
Extra_bddPrint( dd, bCof );
printf( "\n" );
printf( "\n" );
}
    // transfer the function
    bFuncNew = Extra_bddMove( dd, bCof, -Level );  Cudd_Ref( bFuncNew );
if ( fVerbose )
{
Extra_bddPrint( dd, bFuncNew );
printf( "\n" );
printf( "\n" );
}
    pNodeNew->pData = Extra_TransferLevelByLevel( dd, (DdManager *)pNtkNew->pManFunc, bFuncNew );  Cudd_Ref( (DdNode *)pNodeNew->pData );
//Extra_bddPrint( pNtkNew->pManFunc, pNodeNew->pData );
//printf( "\n" );
//printf( "\n" );
    Cudd_RecursiveDeref( dd, bFuncNew );
    return pNodeNew;
}